

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O0

void __thiscall
TokenSplit::tagVariable(TokenSplit *this,char *ptr,syntax_highlight h,Varnode *v,PcodeOp *o)

{
  int4 iVar1;
  PcodeOp *o_local;
  Varnode *v_local;
  syntax_highlight h_local;
  char *ptr_local;
  TokenSplit *this_local;
  
  std::__cxx11::string::operator=((string *)&this->tok,ptr);
  iVar1 = std::__cxx11::string::size();
  this->size = iVar1;
  this->tagtype = vari_t;
  this->delimtype = tokenstring;
  this->hl = h;
  (this->ptr_second).vn = v;
  this->op = o;
  return;
}

Assistant:

void tagVariable(const char *ptr,EmitXml::syntax_highlight h,
		    const Varnode *v,const PcodeOp *o) {
    tok = ptr; size = tok.size();
    tagtype=vari_t; delimtype=tokenstring; hl=h; ptr_second.vn=v; op=o; }